

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergePartialFromCodedStream
          (CodeGeneratorResponse_File *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  uint uVar5;
  uint32 tag;
  
LAB_001890fb:
  do {
    while( true ) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar1 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar5 = tag >> 3;
      uVar3 = tag & 7;
      if (uVar5 != 0xf) break;
      if (uVar3 != 2) goto LAB_0018924e;
LAB_0018926c:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      psVar4 = this->content_;
      if (psVar4 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->content_ = psVar4;
      }
      bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->content_->_M_dataplus)._M_p,(int)this->content_->_M_string_length,PARSE);
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if (uVar5 == 2) {
      if (uVar3 == 2) goto LAB_001891d6;
    }
    else if ((uVar5 == 1) && (uVar3 == 2)) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      psVar4 = this->name_;
      if (psVar4 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar4 = (string *)operator_new(0x20);
        (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        psVar4->_M_string_length = 0;
        (psVar4->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar4;
      }
      bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x12')) {
        input->buffer_ = puVar1 + 1;
LAB_001891d6:
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        psVar4 = this->insertion_point_;
        if (psVar4 == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar4 = (string *)operator_new(0x20);
          (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
          psVar4->_M_string_length = 0;
          (psVar4->field_2)._M_local_buf[0] = '\0';
          this->insertion_point_ = psVar4;
        }
        bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
        if (!bVar2) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->insertion_point_->_M_dataplus)._M_p,
                   (int)this->insertion_point_->_M_string_length,PARSE);
        puVar1 = input->buffer_;
        if ((puVar1 < input->buffer_end_) && (*puVar1 == 'z')) {
          input->buffer_ = puVar1 + 1;
          goto LAB_0018926c;
        }
      }
      goto LAB_001890fb;
    }
LAB_0018924e:
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse_File::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_insertion_point;
        break;
      }

      // optional string insertion_point = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_insertion_point:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_insertion_point()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->insertion_point().data(), this->insertion_point().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_content;
        break;
      }

      // optional string content = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_content:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_content()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->content().data(), this->content().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}